

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.h
# Opt level: O0

void __thiscall Imf_3_2::FrameBuffer::~FrameBuffer(FrameBuffer *this)

{
  std::
  map<Imf_3_2::Name,_Imf_3_2::Slice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~map((map<Imf_3_2::Name,_Imf_3_2::Slice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          *)0x10ab6e);
  return;
}

Assistant:

class IMF_EXPORT_TYPE FrameBuffer
{
public:
    //------------
    // Add a slice
    //------------

    IMF_EXPORT
    void insert (const char name[], const Slice& slice);

    IMF_EXPORT
    void insert (const std::string& name, const Slice& slice);

    //----------------------------------------------------------------
    // Access to existing slices:
    //
    // [n]              Returns a reference to the slice with name n.
    //                  If no slice with name n exists, an IEX_NAMESPACE::ArgExc
    //                  is thrown.
    //
    // findSlice(n)     Returns a pointer to the slice with name n,
    //                  or 0 if no slice with name n exists.
    //
    //----------------------------------------------------------------

    IMF_EXPORT
    Slice& operator[] (const char name[]);
    IMF_EXPORT
    const Slice& operator[] (const char name[]) const;

    IMF_EXPORT
    Slice& operator[] (const std::string& name);
    IMF_EXPORT
    const Slice& operator[] (const std::string& name) const;

    IMF_EXPORT
    Slice* findSlice (const char name[]);
    IMF_EXPORT
    const Slice* findSlice (const char name[]) const;

    IMF_EXPORT
    Slice* findSlice (const std::string& name);
    IMF_EXPORT
    const Slice* findSlice (const std::string& name) const;

    //-----------------------------------------
    // Iterator-style access to existing slices
    //-----------------------------------------

    typedef std::map<Name, Slice> SliceMap;

    class Iterator;
    class ConstIterator;

    IMF_EXPORT
    Iterator begin ();
    IMF_EXPORT
    ConstIterator begin () const;

    IMF_EXPORT
    Iterator end ();
    IMF_EXPORT
    ConstIterator end () const;

    IMF_EXPORT
    Iterator find (const char name[]);
    IMF_EXPORT
    ConstIterator find (const char name[]) const;

    IMF_EXPORT
    Iterator find (const std::string& name);
    IMF_EXPORT
    ConstIterator find (const std::string& name) const;

private:
    SliceMap _map;
}